

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_5450::Indent::~Indent(Indent *this)

{
  pointer pcVar1;
  
  std::__cxx11::string::_M_assign((string *)this->m_indent);
  pcVar1 = (this->m_save)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_save).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~Indent() { m_indent = m_save; }